

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

void Abc_NtkDumpOneCex(FILE *pFile,Abc_Ntk_t *pNtk,Abc_Cex_t *pCex,int fPrintFull,int fNames,
                      int fUseFfNames,int fMinimize,int fUseOldMin,int fCheckCex,int fUseSatBased,
                      int fHighEffort,int fAiger,int fVerbose)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  Aig_Man_t *pAVar4;
  char *pcVar5;
  char *pcVar6;
  Vec_Ptr_t *pVVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  Abc_Cex_t *pCexFull;
  Abc_Cex_t *local_68;
  ulong local_60;
  int local_54;
  long local_50;
  ulong local_48;
  void *local_40;
  int local_34;
  
  if (fPrintFull == 0) {
    if (fNames == 0) {
      pVVar7 = pNtk->vBoxes;
      if (0 < pVVar7->nSize) {
        lVar12 = 0;
        do {
          if ((*(uint *)((long)pVVar7->pArray[lVar12] + 0x14) & 0xf) == 8) {
            fputc(*(long *)((long)pVVar7->pArray[lVar12] + 0x38) == 1 ^ 0x31,(FILE *)pFile);
          }
          lVar12 = lVar12 + 1;
          pVVar7 = pNtk->vBoxes;
        } while (lVar12 < pVVar7->nSize);
      }
      uVar10 = pCex->nRegs;
      if (pCex->nBits <= (int)uVar10) {
        return;
      }
      do {
        if ((fAiger != 0) && ((int)(uVar10 - pCex->nRegs) % pCex->nPis == 0)) {
          fputc(10,(FILE *)pFile);
        }
        fputc((((uint)(&pCex[1].iPo)[(int)uVar10 >> 5] >> (uVar10 & 0x1f) & 1) != 0) + 0x30,
              (FILE *)pFile);
        uVar10 = uVar10 + 1;
      } while ((int)uVar10 < pCex->nBits);
      return;
    }
    local_68 = (Abc_Cex_t *)0x0;
    if (fMinimize == 0) {
      fwrite("# FALSIFYING OUTPUTS:",0x15,1,(FILE *)pFile);
      iVar3 = pCex->iPo;
      if (((long)iVar3 < 0) || (pNtk->vCos->nSize <= iVar3)) goto LAB_0032ab4b;
      pcVar5 = Abc_ObjName((Abc_Obj_t *)pNtk->vCos->pArray[iVar3]);
      fprintf((FILE *)pFile," %s",pcVar5);
    }
    else {
      pAVar4 = Abc_NtkToDar(pNtk,0,1);
      fwrite("# FALSIFYING OUTPUTS:",0x15,1,(FILE *)pFile);
      iVar3 = pCex->iPo;
      if (((long)iVar3 < 0) || (pNtk->vCos->nSize <= iVar3)) {
LAB_0032ab4b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pcVar5 = Abc_ObjName((Abc_Obj_t *)pNtk->vCos->pArray[iVar3]);
      fprintf((FILE *)pFile," %s",pcVar5);
      if (fUseOldMin == 0) {
        if (fUseSatBased == 0) {
          local_68 = Bmc_CexCareMinimize(pAVar4,pAVar4->nTruePis,pCex,4,fCheckCex,fVerbose);
        }
        else {
          local_68 = Bmc_CexCareSatBasedMinimize
                               (pAVar4,pAVar4->nTruePis,pCex,fHighEffort,fCheckCex,fVerbose);
        }
      }
      else {
        local_68 = Saig_ManCbaFindCexCareBits(pAVar4,pCex,0,fVerbose);
        if (fCheckCex != 0) {
          Bmc_CexCareVerify(pAVar4,pCex,local_68,fVerbose);
        }
      }
      Aig_ManStop(pAVar4);
      if (local_68 == (Abc_Cex_t *)0x0) {
        puts("Counter-example minimization has failed.");
      }
    }
    fputc(10,(FILE *)pFile);
    fprintf((FILE *)pFile,"# COUNTEREXAMPLE LENGTH: %u\n",(ulong)(pCex->iFrame + 1));
    if ((fUseFfNames == 0) || (iVar3 = Abc_NtkCheckSpecialPi(pNtk), iVar3 == 0)) {
      pVVar7 = pNtk->vBoxes;
      if (0 < pVVar7->nSize) {
        lVar12 = 0;
        do {
          plVar1 = (long *)pVVar7->pArray[lVar12];
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
            pcVar5 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                  (long)*(int *)plVar1[6] * 8));
            if ((*(uint *)((long)plVar1 + 0x14) & 0xf) != 8) {
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                            ,0x1a8,"int Abc_LatchIsInit0(Abc_Obj_t *)");
            }
            fprintf((FILE *)pFile,"%s@0=%c\n",pcVar5,(ulong)(plVar1[7] == 1 ^ 0x31));
          }
          lVar12 = lVar12 + 1;
          pVVar7 = pNtk->vBoxes;
        } while (lVar12 < pVVar7->nSize);
      }
      if (-1 < pCex->iFrame) {
        uVar15 = 0;
        do {
          pVVar7 = pNtk->vPis;
          iVar3 = (int)uVar15;
          if (0 < pVVar7->nSize) {
            lVar12 = 0;
            do {
              if ((local_68 == (Abc_Cex_t *)0x0) ||
                 (uVar10 = local_68->nPis * iVar3 + local_68->nRegs + (int)lVar12,
                 ((uint)(&local_68[1].iPo)[(int)uVar10 >> 5] >> (uVar10 & 0x1f) & 1) != 0)) {
                pcVar5 = Abc_ObjName((Abc_Obj_t *)pVVar7->pArray[lVar12]);
                uVar10 = pCex->nPis * iVar3 + pCex->nRegs + (int)lVar12;
                fprintf((FILE *)pFile,"%s@%d=%c\n",pcVar5,uVar15,
                        (ulong)((((uint)(&pCex[1].iPo)[(int)uVar10 >> 5] >> (uVar10 & 0x1f) & 1) !=
                                0) + 0x30));
              }
              lVar12 = lVar12 + 1;
              pVVar7 = pNtk->vPis;
            } while (lVar12 < pVVar7->nSize);
          }
          uVar15 = (ulong)(iVar3 + 1);
        } while (iVar3 < pCex->iFrame);
      }
    }
    else {
      pVVar7 = pNtk->vPis;
      if (pVVar7->nSize < 1) {
        uVar15 = 0;
      }
      else {
        uVar15 = 0;
        do {
          pcVar5 = Abc_ObjName((Abc_Obj_t *)pVVar7->pArray[uVar15]);
          iVar3 = strcmp(pcVar5,"_abc_190121_abc_");
          if (iVar3 == 0) break;
          uVar15 = uVar15 + 1;
          pVVar7 = pNtk->vPis;
        } while ((long)uVar15 < (long)pVVar7->nSize);
      }
      local_34 = pNtk->vPis->nSize;
      local_60 = uVar15;
      if ((int)uVar15 == local_34) {
        fwrite("IoCommandWriteCex(): Cannot find special PI required by switch \"-z\".\n",0x45,1,
               _stdout);
      }
      else {
        iVar9 = (int)uVar15 + 1;
        pVVar7 = pNtk->vPis;
        iVar3 = pVVar7->nSize;
        iVar11 = 0;
        iVar13 = 0;
        local_50 = CONCAT44(local_50._4_4_,iVar9);
        if (iVar9 < iVar3) {
          lVar12 = (uVar15 & 0xffffffff) + 1;
          iVar13 = 0;
          do {
            pcVar5 = Abc_ObjName((Abc_Obj_t *)pVVar7->pArray[lVar12]);
            iVar13 = iVar13 + (uint)(*pcVar5 == 'x');
            lVar12 = lVar12 + 1;
            pVVar7 = pNtk->vPis;
            iVar3 = pVVar7->nSize;
          } while ((int)lVar12 < iVar3);
        }
        local_40 = malloc((long)iVar3 << 2);
        memset(local_40,0xff,(long)iVar3 << 2);
        pVVar7 = pNtk->vPis;
        if ((int)local_50 < pVVar7->nSize) {
          local_48 = (ulong)(uint)((int)local_60 - iVar13);
          lVar12 = (local_60 & 0xffffffff) + 1;
          iVar11 = 0;
          do {
            pcVar5 = Abc_ObjName((Abc_Obj_t *)pVVar7->pArray[lVar12]);
            if (*pcVar5 == 'x') {
              iVar3 = (int)local_48 + iVar11;
              iVar11 = iVar11 + 1;
              *(int *)((long)local_40 + lVar12 * 4) = iVar3;
            }
            lVar12 = lVar12 + 1;
            pVVar7 = pNtk->vPis;
          } while ((int)lVar12 < pVVar7->nSize);
        }
        if (iVar11 != iVar13) {
          __assert_fail("iFlop == nXValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/io.c"
                        ,0x9d2,
                        "void Abc_NtkDumpOneCex(FILE *, Abc_Ntk_t *, Abc_Cex_t *, int, int, int, int, int, int, int, int, int, int)"
                       );
        }
        pVVar7 = pNtk->vPis;
        if ((int)local_50 < pVVar7->nSize) {
          uVar15 = local_60 & 0xffffffff;
          local_48 = uVar15 + 1;
          local_50 = (long)local_40 + uVar15 * 4 + 4;
          lVar12 = 0;
          local_54 = iVar13;
          do {
            iVar3 = *(int *)(local_50 + lVar12 * 4);
            if (iVar3 == -1) {
              pcVar5 = Abc_ObjName((Abc_Obj_t *)pVVar7->pArray[uVar15 + lVar12 + 1]);
              if (pNtk->vPis->nSize <= (int)local_48 + (int)lVar12) goto LAB_0032ab4b;
              pcVar6 = Abc_ObjName((Abc_Obj_t *)pNtk->vPis->pArray[uVar15 + lVar12 + 1]);
              uVar10 = (uint)*pcVar6;
LAB_0032aa1e:
              fprintf((FILE *)pFile,"%s@0=%c\n",pcVar5 + 1,(ulong)uVar10);
              iVar13 = local_54;
            }
            else {
              uVar10 = local_68->nRegs + iVar3;
              if (((uint)(&local_68[1].iPo)[(int)uVar10 >> 5] >> (uVar10 & 0x1f) & 1) != 0) {
                pcVar5 = Abc_ObjName((Abc_Obj_t *)pVVar7->pArray[uVar15 + lVar12 + 1]);
                uVar10 = iVar3 + pCex->nRegs;
                uVar10 = (((uint)(&pCex[1].iPo)[(int)uVar10 >> 5] >> (uVar10 & 0x1f) & 1) != 0) +
                         0x30;
                goto LAB_0032aa1e;
              }
            }
            pVVar7 = pNtk->vPis;
            lVar12 = lVar12 + 1;
          } while ((int)local_48 + (int)lVar12 < pVVar7->nSize);
        }
        if (local_40 != (void *)0x0) {
          free(local_40);
        }
        if (-1 < pCex->iFrame) {
          iVar3 = (int)local_60;
          uVar15 = 0;
          do {
            pVVar7 = pNtk->vPis;
            iVar9 = (int)uVar15;
            if (0 < pVVar7->nSize) {
              uVar14 = 0;
              do {
                if ((uint)(iVar3 - iVar13) == uVar14) break;
                if ((local_68 == (Abc_Cex_t *)0x0) ||
                   (uVar10 = local_68->nPis * iVar9 + local_68->nRegs + (int)uVar14,
                   ((uint)(&local_68[1].iPo)[(int)uVar10 >> 5] >> (uVar10 & 0x1f) & 1) != 0)) {
                  pcVar5 = Abc_ObjName((Abc_Obj_t *)pVVar7->pArray[uVar14]);
                  uVar10 = pCex->nPis * iVar9 + pCex->nRegs + (int)uVar14;
                  fprintf((FILE *)pFile,"%s@%d=%c\n",pcVar5,uVar15,
                          (ulong)((((uint)(&pCex[1].iPo)[(int)uVar10 >> 5] >> (uVar10 & 0x1f) & 1)
                                  != 0) + 0x30));
                }
                uVar14 = uVar14 + 1;
                pVVar7 = pNtk->vPis;
              } while ((long)uVar14 < (long)pVVar7->nSize);
            }
            uVar15 = (ulong)(iVar9 + 1);
          } while (iVar9 < pCex->iFrame);
        }
      }
      if ((int)local_60 == local_34) {
        return;
      }
    }
  }
  else {
    pAVar4 = Abc_NtkToDar(pNtk,0,1);
    local_68 = Saig_ManExtendCex(pAVar4,pCex);
    Aig_ManStop(pAVar4);
    if (local_68->nBits != (pCex->iFrame + 1) * pNtk->vCis->nSize) {
      __assert_fail("pCexFull->nBits == Abc_NtkCiNum(pNtk) * (pCex->iFrame + 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/io.c"
                    ,0x999,
                    "void Abc_NtkDumpOneCex(FILE *, Abc_Ntk_t *, Abc_Cex_t *, int, int, int, int, int, int, int, int, int, int)"
                   );
    }
    if (-1 < pCex->iFrame) {
      uVar10 = 0;
      do {
        pVVar7 = pNtk->vCis;
        if (0 < pVVar7->nSize) {
          lVar12 = 0;
          do {
            pcVar5 = Abc_ObjName((Abc_Obj_t *)pVVar7->pArray[lVar12]);
            uVar8 = pNtk->vCis->nSize * uVar10 + (int)lVar12;
            fprintf((FILE *)pFile,"%s@%d=%c ",pcVar5,(ulong)uVar10,
                    (ulong)((((uint)(&local_68[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0)
                           + 0x30));
            lVar12 = lVar12 + 1;
            pVVar7 = pNtk->vCis;
          } while (lVar12 < pVVar7->nSize);
        }
        bVar2 = (int)uVar10 < pCex->iFrame;
        uVar10 = uVar10 + 1;
      } while (bVar2);
    }
  }
  Abc_CexFreeP(&local_68);
  return;
}

Assistant:

void Abc_NtkDumpOneCex( FILE * pFile, Abc_Ntk_t * pNtk, Abc_Cex_t * pCex, 
    int fPrintFull, int fNames, int fUseFfNames, int fMinimize, int fUseOldMin, 
    int fCheckCex, int fUseSatBased, int fHighEffort, int fAiger, int fVerbose )
{
    Abc_Obj_t * pObj;
    int i, f;
    if ( fPrintFull )
    {
        extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
        Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 1 );
        Abc_Cex_t * pCexFull = Saig_ManExtendCex( pAig, pCex );
        Aig_ManStop( pAig );
        // output PI values (while skipping the minimized ones)
        assert( pCexFull->nBits == Abc_NtkCiNum(pNtk) * (pCex->iFrame + 1) );
        for ( f = 0; f <= pCex->iFrame; f++ )
            Abc_NtkForEachCi( pNtk, pObj, i )
                fprintf( pFile, "%s@%d=%c ", Abc_ObjName(pObj), f, '0'+Abc_InfoHasBit(pCexFull->pData, Abc_NtkCiNum(pNtk)*f + i) );
        Abc_CexFreeP( &pCexFull );
    }
    else if ( fNames )
    {
        Abc_Cex_t * pCare = NULL;
        if ( fMinimize )
        {
            extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
            Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 1 );
            fprintf( pFile, "# FALSIFYING OUTPUTS:");                                       
            fprintf( pFile, " %s", Abc_ObjName(Abc_NtkCo(pNtk, pCex->iPo)) ); 
            if ( fUseOldMin )
            {
                pCare = Saig_ManCbaFindCexCareBits( pAig, pCex, 0, fVerbose );
                if ( fCheckCex )
                    Bmc_CexCareVerify( pAig, pCex, pCare, fVerbose );
            }
            else if ( fUseSatBased )
                pCare = Bmc_CexCareSatBasedMinimize( pAig, Saig_ManPiNum(pAig), pCex, fHighEffort, fCheckCex, fVerbose );
            else
                pCare = Bmc_CexCareMinimize( pAig, Saig_ManPiNum(pAig), pCex, 4, fCheckCex, fVerbose );
            Aig_ManStop( pAig );
            if(pCare == NULL)                                           
                printf( "Counter-example minimization has failed.\n" ); 
        }
        else
        {
            fprintf( pFile, "# FALSIFYING OUTPUTS:");                        
            fprintf( pFile, " %s", Abc_ObjName(Abc_NtkCo(pNtk, pCex->iPo)) );
        }
        fprintf( pFile, "\n");                                           
        fprintf( pFile, "# COUNTEREXAMPLE LENGTH: %u\n", pCex->iFrame+1);
        if ( fUseFfNames && Abc_NtkCheckSpecialPi(pNtk) )
        {
            int * pValues;
            int nXValues = 0, iFlop = 0, iPivotPi = -1;
            Abc_NtkForEachPi( pNtk, pObj, iPivotPi )
                if ( !strcmp(Abc_ObjName(pObj), "_abc_190121_abc_") )
                    break;
            if ( iPivotPi == Abc_NtkPiNum(pNtk) )
            {
                fprintf( stdout, "IoCommandWriteCex(): Cannot find special PI required by switch \"-z\".\n" );
                return;
            }
            // count X-valued flops
            for ( i = iPivotPi+1; i < Abc_NtkPiNum(pNtk); i++ )
                if ( Abc_ObjName(Abc_NtkPi(pNtk, i))[0] == 'x' )
                    nXValues++;
            // map X-valued flops into auxiliary PIs
            pValues = ABC_FALLOC( int, Abc_NtkPiNum(pNtk) );
            for ( i = iPivotPi+1; i < Abc_NtkPiNum(pNtk); i++ )
                if ( Abc_ObjName(Abc_NtkPi(pNtk, i))[0] == 'x' )
                    pValues[i] = iPivotPi - nXValues + iFlop++;
            assert( iFlop == nXValues );
            // write flop values
            for ( i = iPivotPi+1; i < Abc_NtkPiNum(pNtk); i++ )
                if ( pValues[i] == -1 )
                    fprintf( pFile, "%s@0=%c\n", Abc_ObjName(Abc_NtkPi(pNtk, i))+1, Abc_ObjName(Abc_NtkPi(pNtk, i))[0] );
                else if ( Abc_InfoHasBit(pCare->pData, pCare->nRegs + pValues[i]) )
                    fprintf( pFile, "%s@0=%c\n", Abc_ObjName(Abc_NtkPi(pNtk, i))+1, '0'+Abc_InfoHasBit(pCex->pData, pCex->nRegs + pValues[i]) );
            ABC_FREE( pValues );
            // output PI values (while skipping the minimized ones)
            for ( f = 0; f <= pCex->iFrame; f++ )
                Abc_NtkForEachPi( pNtk, pObj, i )
                {
                    if ( i == iPivotPi - nXValues ) break;
                    if ( !pCare || Abc_InfoHasBit(pCare->pData, pCare->nRegs+pCare->nPis*f + i) )
                        fprintf( pFile, "%s@%d=%c\n", Abc_ObjName(pObj), f, '0'+Abc_InfoHasBit(pCex->pData, pCex->nRegs+pCex->nPis*f + i) );
                }
        }
        else
        {
            // output flop values (unaffected by the minimization)
            Abc_NtkForEachLatch( pNtk, pObj, i )
                fprintf( pFile, "%s@0=%c\n", Abc_ObjName(Abc_ObjFanout0(pObj)), '0'+!Abc_LatchIsInit0(pObj) );
            // output PI values (while skipping the minimized ones)
            for ( f = 0; f <= pCex->iFrame; f++ )
                Abc_NtkForEachPi( pNtk, pObj, i )
                    if ( !pCare || Abc_InfoHasBit(pCare->pData, pCare->nRegs+pCare->nPis*f + i) )
                        fprintf( pFile, "%s@%d=%c\n", Abc_ObjName(pObj), f, '0'+Abc_InfoHasBit(pCex->pData, pCex->nRegs+pCex->nPis*f + i) );
        }
        Abc_CexFreeP( &pCare );
    }
    else
    {
        Abc_NtkForEachLatch( pNtk, pObj, i )
            fprintf( pFile, "%c", '0'+!Abc_LatchIsInit0(pObj) );

        for ( i = pCex->nRegs; i < pCex->nBits; i++ )
        {
            if ( fAiger && (i-pCex->nRegs)%pCex->nPis == 0)
                fprintf( pFile, "\n");
            fprintf( pFile, "%c", '0'+Abc_InfoHasBit(pCex->pData, i) );
        }
    }
}